

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# restclient.h
# Opt level: O0

void __thiscall rest_client_exception::~rest_client_exception(rest_client_exception *this)

{
  rest_client_exception *this_local;
  
  ~rest_client_exception(this);
  operator_delete(this,0x38);
  return;
}

Assistant:

rest_client_exception(int status_code, const std::string& message):
            status_code(status_code),
            std::runtime_error(message)
    {
        std::stringstream s;
        s << "Error code: " << std::to_string(status_code);
        if(!message.empty())
            s << ";\n" << message;

        msg_ = s.str();
    }